

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_std_tmpfile(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  FILE *f;
  uint *puVar1;
  ulong uVar2;
  JSValue JVar3;
  JSValue val;
  
  f = tmpfile();
  if (0 < argc) {
    if (f == (FILE *)0x0) {
      puVar1 = (uint *)__errno_location();
      uVar2 = (ulong)*puVar1;
    }
    else {
      uVar2 = 0;
    }
    if ((int)argv->tag != 3) {
      JVar3.tag = argv->tag;
      JVar3.u.ptr = (argv->u).ptr;
      val.tag = 0;
      val.u.float64 = (double)uVar2;
      JS_SetPropertyStr(ctx,JVar3,"errno",val);
    }
  }
  if (f == (FILE *)0x0) {
    JVar3 = (JSValue)(ZEXT816(2) << 0x40);
  }
  else {
    JVar3 = js_new_std_file(ctx,(FILE *)f,1,0);
  }
  return JVar3;
}

Assistant:

static JSValue js_std_tmpfile(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    FILE *f;
    f = tmpfile();
    if (argc >= 1)
        js_set_error_object(ctx, argv[0], f ? 0 : errno);
    if (!f)
        return JS_NULL;
    return js_new_std_file(ctx, f, TRUE, FALSE);
}